

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Storage.hpp
# Opt level: O1

Time * __thiscall Storage::Time::operator+=(Time *this,Time *other)

{
  uint uVar1;
  ulong uVar2;
  Time TVar3;
  unsigned_long uVar4;
  ulong __n;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  _Ct __n2;
  _Ct __m2;
  
  uVar6 = (ulong)other->length;
  if (uVar6 != 0) {
    uVar2 = (ulong)this->length;
    if (uVar2 == 0) {
      TVar3 = *other;
    }
    else {
      __n = (ulong)this->clock_rate;
      uVar1 = other->clock_rate;
      if (this->clock_rate == uVar1) {
        uVar2 = uVar2 + uVar6;
      }
      else {
        uVar2 = uVar2 * uVar1 + uVar6 * __n;
        __n = __n * uVar1;
      }
      if ((__n | uVar2) >> 0x20 == 0) {
        this->length = (uint)uVar2;
        this->clock_rate = (uint)__n;
        return this;
      }
      if (uVar2 == 0) {
        TVar3.length = 0;
        TVar3.clock_rate = 1;
      }
      else {
        uVar6 = uVar2;
        uVar7 = __n;
        if (((__n | uVar2) & 0xf) == 0) {
          do {
            uVar2 = uVar6 >> 4;
            __n = uVar7 >> 4;
            uVar1 = (uint)uVar6;
            uVar5 = (uint)uVar7;
            uVar6 = uVar2;
            uVar7 = __n;
          } while (((uVar1 | uVar5) & 0xf0) == 0);
        }
        uVar1 = ((uint)uVar2 | (uint)__n) & 1;
        while (uVar1 == 0) {
          uVar1 = ((uint)uVar2 | (uint)__n) & 2;
          uVar2 = uVar2 >> 1;
          __n = __n >> 1;
        }
        if ((uVar2 >> 0x20 != 0) || (__n >> 0x20 != 0)) {
          uVar4 = std::__detail::__gcd<unsigned_long>(uVar2,__n);
          uVar2 = uVar2 / uVar4;
          __n = __n / uVar4;
          do {
            if (uVar2 >> 0x20 == 0) {
              if (__n >> 0x20 == 0) break;
            }
            else if (__n < 2) break;
            uVar2 = uVar2 >> 1;
            __n = __n >> 1;
          } while( true );
        }
        if ((uVar2 >> 0x20 == 0) && (__n >> 0x20 == 0)) {
          this->length = (uint)uVar2;
          this->clock_rate = (uint)__n;
          return this;
        }
        TVar3.length = 0xffffffff;
        TVar3.clock_rate = 1;
      }
    }
    *this = TVar3;
  }
  return this;
}

Assistant:

inline Time &operator += (const Time &other) {
		if(!other.length) return *this;
		if(!length) {
			*this = other;
			return *this;
		}

		uint64_t result_length;
		uint64_t result_clock_rate;
		if(clock_rate == other.clock_rate) {
			result_length = uint64_t(length) + uint64_t(other.length);
			result_clock_rate = uint64_t(clock_rate);
		} else {
			result_length = uint64_t(length) * uint64_t(other.clock_rate) + uint64_t(other.length) * uint64_t(clock_rate);
			result_clock_rate = uint64_t(clock_rate) * uint64_t(other.clock_rate);
		}
		install_result(result_length, result_clock_rate);
		return *this;
	}